

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::ShaderSerializer<(Diligent::SerializerMode)0>::SerializeBytecodeOrSource
               (Serializer<(Diligent::SerializerMode)0> *Ser,ConstQual<ShaderCreateInfo> *CI)

{
  bool bVar1;
  Char *local_30;
  void *pSource;
  ConstQual<ShaderCreateInfo> *pCStack_20;
  Uint8 UseBytecode;
  ConstQual<ShaderCreateInfo> *CI_local;
  Serializer<(Diligent::SerializerMode)0> *Ser_local;
  
  pSource._7_1_ = '\0';
  pCStack_20 = CI;
  CI_local = (ConstQual<ShaderCreateInfo> *)Ser;
  Serializer<(Diligent::SerializerMode)0>::operator()(Ser,(uchar *)((long)&pSource + 7));
  if (pSource._7_1_ == '\0') {
    local_30 = (Char *)0x0;
    bVar1 = Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                      ((Serializer<(Diligent::SerializerMode)0> *)CI_local,&local_30,
                       &(pCStack_20->field_4).SourceLength,8);
    if (bVar1) {
      pCStack_20->Source = local_30;
      Ser_local._7_1_ = true;
    }
    else {
      Ser_local._7_1_ = false;
    }
  }
  else {
    Ser_local._7_1_ =
         Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                   ((Serializer<(Diligent::SerializerMode)0> *)CI_local,&pCStack_20->ByteCode,
                    &(pCStack_20->field_4).SourceLength,8);
  }
  return Ser_local._7_1_;
}

Assistant:

bool ShaderSerializer<SerializerMode::Read>::SerializeBytecodeOrSource(Serializer<SerializerMode::Read>& Ser,
                                                                       ConstQual<ShaderCreateInfo>&      CI)
{
    Uint8 UseBytecode = 0;
    Ser(UseBytecode);
    if (UseBytecode)
    {
        return Ser.SerializeBytes(CI.ByteCode, CI.ByteCodeSize);
    }
    else
    {
        const void* pSource = nullptr;
        if (!Ser.SerializeBytes(pSource, CI.SourceLength))
            return false;

        CI.Source = reinterpret_cast<const char*>(pSource);
        return true;
    }
}